

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_util.cc
# Opt level: O1

void google::protobuf::internal::SingularFieldHelper<10>::
     Serialize<google::protobuf::io::CodedOutputStream>
               (void *field,FieldMetadata *md,CodedOutputStream *output)

{
  uint32 local_20;
  int local_1c;
  
  local_20 = md->tag;
  PrimitiveTypeHelper<13>::Serialize(&local_20,output);
  SerializeGroupTo<google::protobuf::io::CodedOutputStream>(*field,md->ptr,output);
  local_1c = md->tag + 1;
  PrimitiveTypeHelper<13>::Serialize(&local_1c,output);
  return;
}

Assistant:

static void Serialize(const void* field, const FieldMetadata& md, O* output) {
    WriteTagTo(md.tag, output);
    SerializeGroupTo(Get<const MessageLite*>(field),
                     static_cast<const SerializationTable*>(md.ptr), output);
    WriteTagTo(md.tag + 1, output);
  }